

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int i2c_open(uint i2c_bus,uint i2c_addr,uint32_t i2c_flags)

{
  int iVar1;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  undefined1 local_c [12];
  
  iVar1 = pigpio_command_ext(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                             in_stack_ffffffffffffffe8,(int)((ulong)local_c >> 0x20),(int)local_c,0,
                             unaff_retaddr,in_stack_00000008);
  return iVar1;
}

Assistant:

int i2c_open(unsigned i2c_bus, unsigned i2c_addr, uint32_t i2c_flags)
{
   gpioExtent_t ext[1];

   /*
   p1=i2c_bus
   p2=i2c_addr
   p3=4
   ## extension ##
   uint32_t i2c_flags
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &i2c_flags;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_I2CO, i2c_bus, i2c_addr, 4, 1, ext, 1);
}